

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere)

{
  int iCur;
  sqlite3 *db;
  Select *pSVar1;
  char *zP4;
  VTable *zP4_00;
  int iVar2;
  uint uVar3;
  Table *pTab;
  Trigger *pTrigger;
  Vdbe *p;
  Index *pIVar4;
  FKey *pFVar5;
  WhereInfo *pWInfo;
  Parse *pPVar6;
  int iVar7;
  Schema **ppSVar8;
  Parse *pPVar9;
  int p1;
  int iVar10;
  ulong uVar11;
  NameContext sNC;
  int local_b4;
  char *local_b0;
  NameContext local_68;
  
  db = pParse->db;
  if (((pParse->nErr == 0) && (db->mallocFailed == '\0')) &&
     (pTab = sqlite3SrcListLookup(pParse,pTabList), pTab != (Table *)0x0)) {
    pTrigger = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0);
    pSVar1 = pTab->pSelect;
    iVar2 = sqlite3ViewGetColumnNames(pParse,pTab);
    pPVar9 = (Parse *)0x0;
    local_b0 = (char *)0x0;
    if (iVar2 != 0) goto LAB_0017c8ca;
    iVar2 = sqlite3IsReadOnly(pParse,pTab,(uint)(pTrigger != (Trigger *)0x0));
    if (iVar2 == 0) {
      if (pTab->pSchema == (Schema *)0x0) {
        uVar11 = 0xfff0bdc0;
      }
      else {
        uVar3 = db->nDb;
        if ((int)uVar3 < 1) {
          uVar11 = 0;
        }
        else {
          ppSVar8 = &db->aDb->pSchema;
          uVar11 = 0;
          do {
            if (*ppSVar8 == pTab->pSchema) goto LAB_0017c9ae;
            uVar11 = uVar11 + 1;
            ppSVar8 = ppSVar8 + 4;
          } while (uVar3 != uVar11);
          uVar11 = (ulong)uVar3;
        }
      }
LAB_0017c9ae:
      iVar10 = (int)uVar11;
      iVar2 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,db->aDb[iVar10].zName);
      local_b0 = (char *)0x0;
      pPVar9 = (Parse *)0x0;
      if (iVar2 != 1) {
        iCur = pParse->nTab;
        p1 = iCur + 1;
        pParse->nTab = p1;
        pTabList->a[0].iCursor = iCur;
        pIVar4 = pTab->pIndex;
        if (pIVar4 != (Index *)0x0) {
          iVar7 = pParse->nTab;
          do {
            iVar7 = iVar7 + 1;
            pIVar4 = pIVar4->pNext;
          } while (pIVar4 != (Index *)0x0);
          pParse->nTab = iVar7;
        }
        if (pSVar1 == (Select *)0x0) {
          local_b0 = (char *)0x0;
          pPVar9 = (Parse *)0x0;
        }
        else {
          local_b0 = pParse->zAuthContext;
          pParse->zAuthContext = pTab->zName;
          pPVar9 = pParse;
        }
        p = sqlite3GetVdbe(pParse);
        if (p != (Vdbe *)0x0) {
          if (pParse->nested == '\0') {
            p->field_0x9a = p->field_0x9a | 0x10;
          }
          sqlite3BeginWriteOperation(pParse,1,iVar10);
          if (pSVar1 != (Select *)0x0) {
            sqlite3MaterializeView(pParse,pTab,pWhere,iCur);
          }
          local_68.pNext = (NameContext *)0x0;
          local_68.nRef = 0;
          local_68.nErr = 0;
          local_68.pEList = (ExprList *)0x0;
          local_68.pAggInfo = (AggInfo *)0x0;
          local_68.ncFlags = '\0';
          local_68._49_7_ = 0;
          local_68.pParse = pParse;
          local_68.pSrcList = pTabList;
          iVar7 = sqlite3ResolveExprNames(&local_68,pWhere);
          if (iVar7 == 0) {
            local_b4 = -1;
            if ((db->flags & 0x10) != 0) {
              local_b4 = pParse->nMem + 1;
              pParse->nMem = local_b4;
              sqlite3VdbeAddOp3(p,7,0,local_b4,0);
            }
            if ((((pTrigger == (Trigger *)0x0) && (pWhere == (Expr *)0x0)) &&
                ((iVar2 == 0 && ((pTab->tabFlags & 0x10) == 0)))) &&
               (((pParse->db->flags & 0x40000) == 0 ||
                ((pFVar5 = sqlite3FkReferences(pTab), pFVar5 == (FKey *)0x0 &&
                 (pTab->pFKey == (FKey *)0x0)))))) {
              zP4 = pTab->zName;
              iVar2 = sqlite3VdbeAddOp3(p,0x67,pTab->tnum,iVar10,local_b4);
              sqlite3VdbeChangeP4(p,iVar2,zP4,-2);
              for (pIVar4 = pTab->pIndex; pIVar4 != (Index *)0x0; pIVar4 = pIVar4->pNext) {
                sqlite3VdbeAddOp3(p,0x67,pIVar4->tnum,iVar10,0);
              }
            }
            else {
              iVar2 = pParse->nMem + 1;
              iVar10 = pParse->nMem + 2;
              pParse->nMem = iVar10;
              sqlite3VdbeAddOp3(p,10,0,iVar2,0);
              pWInfo = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,8,0)
              ;
              if (pWInfo == (WhereInfo *)0x0) goto LAB_0017c8ca;
              iVar7 = sqlite3ExprCodeGetColumn(pParse,pTab,-1,iCur,iVar10,'\0');
              sqlite3VdbeAddOp3(p,0x70,iVar2,iVar7,0);
              if ((db->flags & 0x10) != 0) {
                sqlite3VdbeAddOp3(p,0x14,local_b4,1,0);
              }
              sqlite3WhereEnd(pWInfo);
              uVar3 = sqlite3VdbeMakeLabel(p);
              if (pSVar1 == (Select *)0x0) {
                sqlite3OpenTableAndIndices(pParse,pTab,iCur,0x28);
              }
              iVar2 = sqlite3VdbeAddOp3(p,0x71,iVar2,uVar3,iVar10);
              if ((pTab->tabFlags & 0x10) == 0) {
                sqlite3GenerateRowDelete
                          (pParse,pTab,iCur,iVar10,(uint)(pParse->nested == '\0'),pTrigger,99);
              }
              else {
                for (zP4_00 = pTab->pVTable; (zP4_00 != (VTable *)0x0 && (zP4_00->db != db));
                    zP4_00 = zP4_00->pNext) {
                }
                sqlite3VtabMakeWritable(pParse,pTab);
                iVar10 = sqlite3VdbeAddOp3(p,0x8c,0,1,iVar10);
                sqlite3VdbeChangeP4(p,iVar10,(char *)zP4_00,-10);
                if (p->aOp != (Op *)0x0) {
                  p->aOp[(long)p->nOp + -1].p5 = '\x02';
                }
                pPVar6 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar6 = pParse;
                }
                pPVar6->mayAbort = '\x01';
              }
              sqlite3VdbeAddOp3(p,1,0,iVar2,0);
              if (p->aLabel != (int *)0x0) {
                p->aLabel[(int)~uVar3] = p->nOp;
              }
              if ((pSVar1 == (Select *)0x0) && ((pTab->tabFlags & 0x10) == 0)) {
                for (pIVar4 = pTab->pIndex; pIVar4 != (Index *)0x0; pIVar4 = pIVar4->pNext) {
                  sqlite3VdbeAddOp3(p,0x2d,p1,pIVar4->tnum,0);
                  p1 = p1 + 1;
                }
                sqlite3VdbeAddOp3(p,0x2d,iCur,0,0);
              }
              if (pWInfo == (WhereInfo *)0x0) goto LAB_0017c8ca;
            }
            if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3AutoincrementEnd(pParse);
            }
            if ((((db->flags & 0x10) != 0) && (pParse->nested == '\0')) &&
               (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3VdbeAddOp3(p,0x10,local_b4,1,0);
              sqlite3VdbeSetNumCols(p,1);
              if (p->db->mallocFailed == '\0') {
                sqlite3VdbeMemSetStr
                          (p->aColName,"rows deleted",-1,'\x01',(_func_void_void_ptr *)0x0);
              }
            }
          }
        }
      }
      goto LAB_0017c8ca;
    }
  }
  local_b0 = (char *)0x0;
  pPVar9 = (Parse *)0x0;
LAB_0017c8ca:
  if (pPVar9 != (Parse *)0x0) {
    pPVar9->zAuthContext = local_b0;
  }
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprDelete(db,pWhere);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere           /* The WHERE clause.  May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  const char *zDb;       /* Name of database holding pTab */
  int end, addr = 0;     /* A couple addresses of generated code */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iCur;              /* VDBE Cursor number for pTab */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = -1;       /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto delete_from_cleanup;
  }
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define isView 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, (pTrigger?1:0)) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  zDb = db->aDb[iDb].zName;
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign  cursor number to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, 1, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** a ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, pWhere, iCur);
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( db->flags & SQLITE_CountRows ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by 
  ** API function sqlite3_count_changes) to be set incorrectly.  */
  if( rcauth==SQLITE_OK && pWhere==0 && !pTrigger && !IsVirtual(pTab) 
   && 0==sqlite3FkRequired(pParse, pTab, 0, 0)
  ){
    assert( !isView );
    sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt,
                      pTab->zName, P4_STATIC);
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  /* The usual case: There is a WHERE clause so we have to scan through
  ** the table and pick which records to delete.
  */
  {
    int iRowSet = ++pParse->nMem;   /* Register for rowset of rows to delete */
    int iRowid = ++pParse->nMem;    /* Used for storing rowid values. */
    int regRowid;                   /* Actual register containing rowids */

    /* Collect rowids of every row to be deleted.
    */
    sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    pWInfo = sqlite3WhereBegin(
        pParse, pTabList, pWhere, 0, 0, WHERE_DUPLICATES_OK, 0
    );
    if( pWInfo==0 ) goto delete_from_cleanup;
    regRowid = sqlite3ExprCodeGetColumn(pParse, pTab, -1, iCur, iRowid, 0);
    sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, regRowid);
    if( db->flags & SQLITE_CountRows ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }
    sqlite3WhereEnd(pWInfo);

    /* Delete every item whose key was written to the list during the
    ** database scan.  We have to delete items after the scan is complete
    ** because deleting an item can change the scan order.  */
    end = sqlite3VdbeMakeLabel(v);

    /* Unless this is a view, open cursors for the table we are 
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF 
    ** triggers.  */
    if( !isView ){
      sqlite3OpenTableAndIndices(pParse, pTab, iCur, OP_OpenWrite);
    }

    addr = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, end, iRowid);

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iRowid, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
      sqlite3MayAbort(pParse);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, iCur, iRowid, count, pTrigger, OE_Default);
    }

    /* End of the delete loop */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
    sqlite3VdbeResolveLabel(v, end);

    /* Close the cursors open on the table and its indexes. */
    if( !isView && !IsVirtual(pTab) ){
      for(i=1, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
        sqlite3VdbeAddOp2(v, OP_Close, iCur + i, pIdx->tnum);
      }
      sqlite3VdbeAddOp1(v, OP_Close, iCur);
    }
  }

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( (db->flags&SQLITE_CountRows) && !pParse->nested && !pParse->pTriggerTab ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, memCnt, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows deleted", SQLITE_STATIC);
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
  return;
}